

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSpvAsmInstructionTests.cpp
# Opt level: O1

string * __thiscall
vkt::SpirVAssembly::getTypeName_abi_cxx11_
          (string *__return_storage_ptr__,SpirVAssembly *this,IntegerType type)

{
  long lVar1;
  long *plVar2;
  size_type *psVar3;
  IntegerType type_00;
  char *pcVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string prefix;
  long *local_88 [2];
  long local_78 [2];
  string local_68;
  long *local_48;
  long local_40;
  long local_38 [2];
  
  pcVar4 = "";
  if (2 < (int)this) {
    pcVar4 = "u";
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,pcVar4,pcVar4 + (2 < (int)this));
  local_88[0] = local_78;
  std::__cxx11::string::_M_construct<char*>((string *)local_88,local_48,local_40 + (long)local_48);
  std::__cxx11::string::append((char *)local_88);
  getBitWidthStr_abi_cxx11_(&local_68,(SpirVAssembly *)((ulong)this & 0xffffffff),type_00);
  plVar2 = (long *)std::__cxx11::string::_M_append
                             ((char *)local_88,(ulong)local_68._M_dataplus._M_p);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar3 = (size_type *)(plVar2 + 2);
  if ((size_type *)*plVar2 == psVar3) {
    lVar1 = plVar2[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar2;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar3;
  }
  __return_storage_ptr__->_M_string_length = plVar2[1];
  *plVar2 = (long)psVar3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_88[0] != local_78) {
    operator_delete(local_88[0],local_78[0] + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

const string getTypeName (IntegerType type)
{
	string prefix = isSigned(type) ? "" : "u";
	return prefix + "int" + getBitWidthStr(type);
}